

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsBlurEffect::setBlurHints(QGraphicsBlurEffect *this,BlurHints hints)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QGraphicsBlurEffect::BlurHint> lhs;
  QGraphicsBlurEffectPrivate *pQVar3;
  QFlags<QGraphicsBlurEffect::BlurHint> in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGraphicsBlurEffectPrivate *d;
  QFlagsStorage<QGraphicsBlurEffect::BlurHint> _t1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QFlagsStorage<QGraphicsBlurEffect::BlurHint> hints_00;
  
  _t1.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsBlurEffect *)0x4a47ad);
  hints_00.i = (Int)((ulong)pQVar3 >> 0x20);
  lhs.i = (Int)QPixmapBlurFilter::blurHints
                         ((QPixmapBlurFilter *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  bVar2 = ::operator==((QFlags<QGraphicsBlurEffect::BlurHint>)lhs.i,in_ESI);
  if (!bVar2) {
    QPixmapBlurFilter::setBlurHints
              ((QPixmapBlurFilter *)CONCAT44(lhs.i,in_stack_ffffffffffffffd0),(BlurHints)hints_00.i)
    ;
    blurHintsChanged((QGraphicsBlurEffect *)0x4a4816,(BlurHints)_t1.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsBlurEffect::setBlurHints(QGraphicsBlurEffect::BlurHints hints)
{
    Q_D(QGraphicsBlurEffect);
    if (d->filter->blurHints() == hints)
        return;

    d->filter->setBlurHints(hints);
    emit blurHintsChanged(hints);
}